

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Options *pOVar5;
  string_view local_3f8;
  string_view local_3e8;
  Semantic local_3d4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3d0;
  string_view local_3c8;
  string_view local_3b8;
  string_view local_3a8;
  Options local_398;
  Semantic local_344;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_340;
  string_view local_338;
  string_view local_328;
  string_view local_318;
  Options local_308;
  Semantic local_2b4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2b0;
  string_view local_2a8;
  string_view local_298;
  string_view local_288;
  Options local_278;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_220;
  string_view local_218;
  string_view local_208;
  string_view local_1f8;
  Options local_1e8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  Options local_98;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = FieldDescriptor::has_presence((this->super_ImmutableStringFieldGenerator).descriptor_);
  local_31 = 0;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/full/string_field.cc"
               ,0x21a,"descriptor_->has_presence()");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  pPVar2 = local_18;
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_98,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_98,false,false,false);
  Options::~Options(&local_98);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_b8,local_c8,pFVar1,local_d0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_128,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_128,false,false,false);
  Options::~Options(&local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,
             "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (!(ref instanceof java.lang.String)) {\n    com.google.protobuf.ByteString bs =\n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n    if ($has_oneof_case_message$) {\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_160);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_148,local_158,pFVar1,local_160);
  bVar3 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_178,"      $oneof_name$_ = s;\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_178);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"      if (bs.isValidUtf8()) {\n        $oneof_name$_ = s;\n      }\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_188);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "    }\n    return s;\n  } else {\n    return (java.lang.String) ref;\n  }\n}\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_198);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_1e8,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,GETTER,&local_1e8,false,false,false);
  Options::~Options(&local_1e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,
             "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    if ($has_oneof_case_message$) {\n      $oneof_name$_ = b;\n    }\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_1f8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_218,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_220);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_208,local_218,pFVar1,local_220);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_278,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_278,true,false,false);
  Options::~Options(&local_278);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_288,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  $null_check$\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_288);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_298,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  local_2b4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_2b0,&local_2b4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_298,local_2a8,pFVar1,local_2b0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_308,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_308,true,false,false);
  Options::~Options(&local_308);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_318,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_318);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_338,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  local_344 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_340,&local_344);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_328,local_338,pFVar1,local_340);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  Options::Options(&local_398,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,SETTER,&local_398,true,false,false);
  Options::~Options(&local_398);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a8,
             "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  $null_check$\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_3a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c8,"}");
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  local_3d4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3d0,&local_3d4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_3b8,local_3c8,pFVar1,local_3d0);
  bVar3 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3e8,"  checkByteStringIsUtf8(value);\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_3e8);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3f8,
             "  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_3f8);
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.Object ref $default_init$;\n"
      "  if ($has_oneof_case_message$) {\n"
      "    ref = $oneof_name$_;\n"
      "  }\n"
      "  if (!(ref instanceof java.lang.String)) {\n"
      "    com.google.protobuf.ByteString bs =\n"
      "        (com.google.protobuf.ByteString) ref;\n"
      "    java.lang.String s = bs.toStringUtf8();\n"
      "    if ($has_oneof_case_message$) {\n");
  printer->Annotate("{", "}", descriptor_);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "      $oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "      if (bs.isValidUtf8()) {\n"
                   "        $oneof_name$_ = s;\n"
                   "      }\n");
  }
  printer->Print(variables_,
                 "    }\n"
                 "    return s;\n"
                 "  } else {\n"
                 "    return (java.lang.String) ref;\n"
                 "  }\n"
                 "}\n");

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.Object ref $default_init$;\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    ref = $oneof_name$_;\n"
                 "  }\n"
                 "  if (ref instanceof String) {\n"
                 "    com.google.protobuf.ByteString b = \n"
                 "        com.google.protobuf.ByteString.copyFromUtf8(\n"
                 "            (java.lang.String) ref);\n"
                 "    if ($has_oneof_case_message$) {\n"
                 "      $oneof_name$_ = b;\n"
                 "    }\n"
                 "    return b;\n"
                 "  } else {\n"
                 "    return (com.google.protobuf.ByteString) ref;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  $null_check$\n"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    $clear_oneof_case_message$;\n"
      "    $oneof_name$_ = null;\n"
      "    $on_changed$\n"
      "  }\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          context_->options(),
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  $null_check$\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}